

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O0

bool __thiscall
hwtest::pgraph::anon_unknown_15::MthdSurfSwzFormat::is_valid_val(MthdSurfSwzFormat *this)

{
  uint uVar1;
  uint uVar2;
  int swzy;
  int swzx;
  int fmt;
  MthdSurfSwzFormat *this_local;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val & 0xffff;
  if (uVar1 != 0) {
    uVar2 = 0xd;
    if (((this->super_SingleMthdTest).super_MthdTest.cls & 0xff00) != 0) {
      uVar2 = 0xe;
    }
    if (uVar1 <= uVar2) {
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.val >> 0x10 & 0xff;
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.val >> 0x18;
      if (0xb < uVar2) {
        return false;
      }
      if (0xb < uVar1) {
        return false;
      }
      if (uVar2 == 0) {
        return false;
      }
      if ((uVar1 == 0) && ((this->super_SingleMthdTest).super_MthdTest.cls == 0x52)) {
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		int fmt = extr(val, 0, 16);
		if (fmt == 0 || fmt > (cls & 0xff00 ? 0xe : 0xd))
			return false;
		int swzx = extr(val, 16, 8);
		int swzy = extr(val, 24, 8);
		if (swzx > 0xb)
			return false;
		if (swzy > 0xb)
			return false;
		if (swzx == 0)
			return false;
		if (swzy == 0 && cls == 0x52)
			return false;
		return true;
	}